

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Pubkey * cfd::core::Pubkey::CombinePubkey
                   (Pubkey *__return_storage_ptr__,Pubkey *pubkey,Pubkey *message_key)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> data_list;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetData((ByteData *)&local_60,pubkey);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
  emplace_back<cfd::core::ByteData>(&local_48,(ByteData *)&local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  GetData((ByteData *)&local_60,message_key);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
  emplace_back<cfd::core::ByteData>(&local_48,(ByteData *)&local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  WallyUtil::CombinePubkeySecp256k1Ec((ByteData *)&local_28,&local_48);
  Pubkey(__return_storage_ptr__,(ByteData *)&local_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::CombinePubkey(const Pubkey &pubkey, const Pubkey &message_key) {
  std::vector<ByteData> data_list;
  data_list.push_back(pubkey.GetData());
  data_list.push_back(message_key.GetData());

  return Pubkey(WallyUtil::CombinePubkeySecp256k1Ec(data_list));
}